

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  FP *pFVar1;
  double dVar2;
  double dVar3;
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  PositionType position_1;
  PositionType position;
  ParticleType particle;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_70;
  undefined8 local_68;
  Particle local_58;
  
  local_78 = 0xc024000000000000;
  sStack_70.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
  local_68 = 0xc024000000000000;
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  uStack_90 = 0x4024000000000000;
  local_88 = 0x4024000000000000;
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  minPosition.z = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  maxPosition.z = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&local_58,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,minPosition,
             maxPosition);
  dVar2 = *(double *)(pica::ParticleTypes::types + (long)local_58.typeIndex * 0x10);
  dVar6 = local_58.p.x * 29979245800.0 * dVar2;
  dVar7 = local_58.p.y * 29979245800.0 * dVar2;
  dVar3 = local_58.p.z * 29979245800.0 * dVar2;
  dVar2 = (dVar3 * dVar3 + dVar6 * dVar6 + dVar7 * dVar7) /
          (dVar2 * 29979245800.0 * dVar2 * 29979245800.0) + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
            maxAbsoluteError;
  if (ABS(dVar2) < *pFVar1 || ABS(dVar2) == *pFVar1) {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS(dVar2 + -1.0 / local_58.invGamma);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&local_78,"fabs(expectedGamma - particle.getGamma())",
               "this->maxAbsoluteError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxAbsoluteError);
    if (local_78._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (sStack_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((sStack_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0xa3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS((-1.0 / local_58.invGamma + dVar2) / dVar2);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&local_78,
               "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
               "this->maxRelativeError",(double *)&local_98,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)3>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>.super_BaseFixture.
                maxRelativeError);
    if (local_78._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (sStack_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((sStack_70.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0xa3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}